

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualizer.cc
# Opt level: O2

Ptr __thiscall
features::Visualizer::draw_keypoints
          (Visualizer *this,ConstPtr *image,
          vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
          *matches,KeypointStyle style)

{
  int iVar1;
  pointer pKVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  size_t i;
  ulong uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar5;
  Ptr PVar6;
  __shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_58;
  KeypointStyle local_44;
  __shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  iVar1 = (((image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
  local_44 = style;
  if (iVar1 == 1) {
    std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               &image->
                super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
    core::image::expand_grayscale<unsigned_char>((image *)&local_40,(ConstPtr *)&local_58);
    std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)this,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    this_00 = &local_58._M_refcount;
  }
  else {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)matches;
    if (iVar1 != 3) goto LAB_001098c5;
    std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,
               &image->
                super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
    core::image::desaturate<unsigned_char>
              ((image *)&local_40,(ConstPtr *)&local_78,DESATURATE_AVERAGE);
    std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)this,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<unsigned_char>,void>
              (local_68,(__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)this
              );
    core::image::expand_grayscale<unsigned_char>((image *)&local_40,(ConstPtr *)local_68);
    std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)this,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    this_00 = &local_60;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  _Var3._M_pi = extraout_RDX;
LAB_001098c5:
  lVar5 = 0;
  for (uVar4 = 0;
      pKVar2 = (matches->
               super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(matches->
                            super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pKVar2 >> 4);
      uVar4 = uVar4 + 1) {
    draw_keypoint(*(ByteImage **)this,(Keypoint *)((long)&pKVar2->x + lVar5),local_44,
                  (anonymous_namespace)::color_table + 9);
    lVar5 = lVar5 + 0x10;
    _Var3._M_pi = extraout_RDX_00;
  }
  PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar6.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

core::ByteImage::Ptr
Visualizer::draw_keypoints(core::ByteImage::ConstPtr image,
    std::vector<Visualizer::Keypoint> const& matches,
    Visualizer::KeypointStyle style)
{
    core::ByteImage::Ptr ret;
    if (image->channels() == 3)
    {
        ret = core::image::desaturate<unsigned char>(image, core::image::DESATURATE_AVERAGE);
        ret = core::image::expand_grayscale<unsigned char>(ret);
    }
    else if (image->channels() == 1)
    {
        ret = core::image::expand_grayscale<unsigned char>(image);
    }

    uint8_t* color = color_table[3];
    for (std::size_t i = 0; i < matches.size(); ++i)
    {
        Visualizer::draw_keypoint(*ret, matches[i], style, color);
    }

    return ret;
}